

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_31;
  shared_ptr<const_cxxopts::Value> *local_30;
  shared_ptr<const_cxxopts::Value> *val_local;
  String *desc_local;
  string *long__local;
  string *short__local;
  OptionDetails *this_local;
  
  local_30 = val;
  val_local = (shared_ptr<const_cxxopts::Value> *)desc;
  desc_local = long_;
  long__local = short_;
  short__local = &this->m_short;
  std::__cxx11::string::string((string *)this,short_);
  std::__cxx11::string::string((string *)&this->m_long,long_);
  std::__cxx11::string::string((string *)&this->m_desc,desc);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr(&this->m_value,val);
  this->m_count = 0;
  this->m_hash = 0;
  std::operator+(&local_58,&this->m_long,&this->m_short);
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_31,&local_58);
  this->m_hash = sVar1;
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

OptionDetails
    (
      std::string short_,
      std::string long_,
      String desc,
      std::shared_ptr<const Value> val
    )
    : m_short(std::move(short_))
    , m_long(std::move(long_))
    , m_desc(std::move(desc))
    , m_value(std::move(val))
    , m_count(0)
    {
      m_hash = std::hash<std::string>{}(m_long + m_short);
    }